

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sDrawTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Stress::anon_unknown_0::IndexGroup::init(IndexGroup *this,EVP_PKEY_CTX *ctx)

{
  TestContext *testCtx;
  undefined8 this_00;
  int extraout_EAX;
  TestNode *node;
  long lVar1;
  DrawTest *pDVar2;
  RenderContext *renderCtx;
  char *pcVar3;
  char *desc_00;
  IndexType type;
  IndexType type_00;
  Storage storage;
  bool bVar4;
  bool bVar5;
  string local_278;
  allocator<char> local_251;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  undefined1 local_230 [8];
  string iterationDesc;
  int iterationNdx;
  MovePtr<deqp::gls::DrawTest,_de::DefaultDeleter<deqp::gls::DrawTest>_> test;
  string local_1d8;
  allocator<char> local_1b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  undefined1 local_150 [8];
  string desc;
  allocator<char> local_109;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  undefined1 local_e8 [8];
  string name;
  TestCaseGroup *group;
  IndexTest *indexTest;
  int testNdx;
  bool isRangedMethod;
  TestCaseGroup *unalignedBufferGroup;
  DrawTestSpec spec;
  IndexTest tests [2];
  IndexGroup *this_local;
  
  spec.attribs.
  super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x100000001;
  deqp::gls::DrawTestSpec::DrawTestSpec((DrawTestSpec *)&unalignedBufferGroup);
  node = (TestNode *)operator_new(0x70);
  tcu::TestCaseGroup::TestCaseGroup
            ((TestCaseGroup *)node,
             (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
             "unaligned_buffer","unaligned buffer");
  bVar4 = true;
  if (this->m_method != DRAWMETHOD_DRAWELEMENTS_RANGED) {
    bVar4 = this->m_method == DRAWMETHOD_DRAWELEMENTS_RANGED_BASEVERTEX;
  }
  genBasicSpec((DrawTestSpec *)&unalignedBufferGroup,this->m_method);
  tcu::TestNode::addChild((TestNode *)this,node);
  for (indexTest._4_4_ = 0; indexTest._4_4_ < 2; indexTest._4_4_ = indexTest._4_4_ + 1) {
    lVar1 = (long)indexTest._4_4_;
    name.field_2._8_8_ = node;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_108,"index_",&local_109);
    deqp::gls::DrawTestSpec::indexTypeToString_abi_cxx11_
              ((string *)((long)&desc.field_2 + 8),
               (DrawTestSpec *)(ulong)(uint)tests[lVar1 + -1].offsets[2],type);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e8,
                   &local_108,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&desc.field_2 + 8));
    std::__cxx11::string::~string((string *)(desc.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&local_108);
    std::allocator<char>::~allocator(&local_109);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_1b0,"index ",&local_1b1);
    deqp::gls::DrawTestSpec::indexTypeToString_abi_cxx11_
              (&local_1d8,(DrawTestSpec *)(ulong)(uint)tests[lVar1 + -1].offsets[2],type_00);
    std::operator+(&local_190,&local_1b0,&local_1d8);
    std::operator+(&local_170,&local_190," in ");
    deqp::gls::DrawTestSpec::storageToString_abi_cxx11_
              ((string *)
               &test.super_UniqueBase<deqp::gls::DrawTest,_de::DefaultDeleter<deqp::gls::DrawTest>_>
                .m_data.field_0x8,(DrawTestSpec *)(ulong)(uint)tests[lVar1 + -1].offsets[1],storage)
    ;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150,
                   &local_170,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &test.
                    super_UniqueBase<deqp::gls::DrawTest,_de::DefaultDeleter<deqp::gls::DrawTest>_>.
                    m_data.field_0x8);
    std::__cxx11::string::~string
              ((string *)
               &test.super_UniqueBase<deqp::gls::DrawTest,_de::DefaultDeleter<deqp::gls::DrawTest>_>
                .m_data.field_0x8);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::~string((string *)&local_1d8);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::allocator<char>::~allocator(&local_1b1);
    pDVar2 = (DrawTest *)operator_new(0x138);
    testCtx = (this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx;
    renderCtx = Context::getRenderContext((this->super_TestCaseGroup).m_context);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    desc_00 = (char *)std::__cxx11::string::c_str();
    deqp::gls::DrawTest::DrawTest(pDVar2,testCtx,renderCtx,pcVar3,desc_00);
    de::DefaultDeleter<deqp::gls::DrawTest>::DefaultDeleter
              ((DefaultDeleter<deqp::gls::DrawTest> *)(iterationDesc.field_2._M_local_buf + 0xf));
    de::details::MovePtr<deqp::gls::DrawTest,_de::DefaultDeleter<deqp::gls::DrawTest>_>::MovePtr
              ((MovePtr<deqp::gls::DrawTest,_de::DefaultDeleter<deqp::gls::DrawTest>_> *)
               &iterationNdx,pDVar2);
    spec.primitiveCount = tests[lVar1 + -1].offsets[2];
    spec.indexType = tests[lVar1 + -1].offsets[1];
    if (bVar4) {
      spec.indexStorage = STORAGE_USER;
      spec.first = 0x37;
    }
    iterationDesc.field_2._8_4_ = 0;
    while( true ) {
      this_00 = name.field_2._8_8_;
      bVar5 = false;
      if ((int)iterationDesc.field_2._8_4_ < 3) {
        bVar5 = tests[lVar1].offsets[(long)(int)iterationDesc.field_2._8_4_ + -2] != -1;
      }
      if (!bVar5) break;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_250,"offset ",&local_251);
      de::toString<int>(&local_278,
                        tests[lVar1].offsets + (long)(int)iterationDesc.field_2._8_4_ + -2);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_230,
                     &local_250,&local_278);
      std::__cxx11::string::~string((string *)&local_278);
      std::__cxx11::string::~string((string *)&local_250);
      std::allocator<char>::~allocator(&local_251);
      spec.drawMethod = tests[lVar1].offsets[(long)(int)iterationDesc.field_2._8_4_ + -2];
      pDVar2 = de::details::
               UniqueBase<deqp::gls::DrawTest,_de::DefaultDeleter<deqp::gls::DrawTest>_>::operator->
                         ((UniqueBase<deqp::gls::DrawTest,_de::DefaultDeleter<deqp::gls::DrawTest>_>
                           *)&iterationNdx);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      deqp::gls::DrawTest::addIteration(pDVar2,(DrawTestSpec *)&unalignedBufferGroup,pcVar3);
      std::__cxx11::string::~string((string *)local_230);
      iterationDesc.field_2._8_4_ = iterationDesc.field_2._8_4_ + 1;
    }
    pDVar2 = de::details::MovePtr<deqp::gls::DrawTest,_de::DefaultDeleter<deqp::gls::DrawTest>_>::
             release((MovePtr<deqp::gls::DrawTest,_de::DefaultDeleter<deqp::gls::DrawTest>_> *)
                     &iterationNdx);
    tcu::TestNode::addChild((TestNode *)this_00,(TestNode *)pDVar2);
    de::details::MovePtr<deqp::gls::DrawTest,_de::DefaultDeleter<deqp::gls::DrawTest>_>::~MovePtr
              ((MovePtr<deqp::gls::DrawTest,_de::DefaultDeleter<deqp::gls::DrawTest>_> *)
               &iterationNdx);
    std::__cxx11::string::~string((string *)local_150);
    std::__cxx11::string::~string((string *)local_e8);
  }
  deqp::gls::DrawTestSpec::~DrawTestSpec((DrawTestSpec *)&unalignedBufferGroup);
  return extraout_EAX;
}

Assistant:

void IndexGroup::init (void)
{
	struct IndexTest
	{
		gls::DrawTestSpec::Storage		storage;
		gls::DrawTestSpec::IndexType	type;
		bool							aligned;
		int								offsets[3];
	};

	const IndexTest tests[] =
	{
		{ gls::DrawTestSpec::STORAGE_BUFFER,	gls::DrawTestSpec::INDEXTYPE_SHORT,	false,	{ 1, 3, -1 } },
		{ gls::DrawTestSpec::STORAGE_BUFFER,	gls::DrawTestSpec::INDEXTYPE_INT,	false,	{ 2, 3, -1 } },
	};

	gls::DrawTestSpec spec;

	tcu::TestCaseGroup* const	unalignedBufferGroup	= new tcu::TestCaseGroup(m_testCtx, "unaligned_buffer", "unaligned buffer");
	const bool					isRangedMethod			= (m_method == gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_RANGED || m_method == gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_RANGED_BASEVERTEX);

	genBasicSpec(spec, m_method);

	this->addChild(unalignedBufferGroup);

	for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(tests); ++testNdx)
	{
		const IndexTest&				indexTest	= tests[testNdx];

		DE_ASSERT(indexTest.storage != gls::DrawTestSpec::STORAGE_USER);
		DE_ASSERT(!indexTest.aligned);
		tcu::TestCaseGroup*				group		= unalignedBufferGroup;

		const std::string				name		= std::string("index_") + gls::DrawTestSpec::indexTypeToString(indexTest.type);
		const std::string				desc		= std::string("index ") + gls::DrawTestSpec::indexTypeToString(indexTest.type) + " in " + gls::DrawTestSpec::storageToString(indexTest.storage);
		de::MovePtr<gls::DrawTest>		test		(new gls::DrawTest(m_testCtx, m_context.getRenderContext(), name.c_str(), desc.c_str()));

		spec.indexType			= indexTest.type;
		spec.indexStorage		= indexTest.storage;

		if (isRangedMethod)
		{
			spec.indexMin = 0;
			spec.indexMax = 55;
		}

		for (int iterationNdx = 0; iterationNdx < DE_LENGTH_OF_ARRAY(indexTest.offsets) && indexTest.offsets[iterationNdx] != -1; ++iterationNdx)
		{
			const std::string iterationDesc = std::string("offset ") + de::toString(indexTest.offsets[iterationNdx]);
			spec.indexPointerOffset	= indexTest.offsets[iterationNdx];
			test->addIteration(spec, iterationDesc.c_str());
		}

		DE_ASSERT(spec.isCompatibilityTest() == gls::DrawTestSpec::COMPATIBILITY_UNALIGNED_OFFSET ||
				  spec.isCompatibilityTest() == gls::DrawTestSpec::COMPATIBILITY_UNALIGNED_STRIDE);
		group->addChild(test.release());
	}
}